

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::HttpInputStream::Response> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Response>::operator=
          (ExceptionOr<kj::HttpInputStream::Response> *this,
          ExceptionOr<kj::HttpInputStream::Response> *param_1)

{
  AsyncInputStream *pAVar1;
  Disposer *pDVar2;
  undefined8 uVar3;
  char *pcVar4;
  HttpHeaders *pHVar5;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pAVar1 = (this->value).ptr.field_1.value.body.ptr;
      if (pAVar1 != (AsyncInputStream *)0x0) {
        (this->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.body.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pAVar1->_vptr_AsyncInputStream +
                          (long)pAVar1->_vptr_AsyncInputStream[-2]));
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      uVar3 = *(undefined8 *)&(param_1->value).ptr.field_1;
      pcVar4 = (param_1->value).ptr.field_1.value.statusText.content.ptr;
      pHVar5 = (param_1->value).ptr.field_1.value.headers;
      (this->value).ptr.field_1.value.statusText.content.size_ =
           (param_1->value).ptr.field_1.value.statusText.content.size_;
      (this->value).ptr.field_1.value.headers = pHVar5;
      *(undefined8 *)&(this->value).ptr.field_1 = uVar3;
      (this->value).ptr.field_1.value.statusText.content.ptr = pcVar4;
      (this->value).ptr.field_1.value.body.disposer =
           (param_1->value).ptr.field_1.value.body.disposer;
      (this->value).ptr.field_1.value.body.ptr = (param_1->value).ptr.field_1.value.body.ptr;
      (param_1->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    pAVar1 = (param_1->value).ptr.field_1.value.body.ptr;
    if (pAVar1 != (AsyncInputStream *)0x0) {
      (param_1->value).ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
      pDVar2 = (param_1->value).ptr.field_1.value.body.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pAVar1->_vptr_AsyncInputStream +
                        (long)pAVar1->_vptr_AsyncInputStream[-2]));
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;